

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

_Bool object_similar(object *obj1,object *obj2,object_stack_t mode)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  long lVar4;
  
  _Var1 = object_is_equipped(player->body,obj1);
  if ((((!_Var1) && (_Var1 = object_is_equipped(player->body,obj2), !_Var1)) &&
      (obj1->mimicking_m_idx == 0)) && (obj2->mimicking_m_idx == 0)) {
    if ((mode & OSTACK_LIST) == OSTACK_NONE) {
      if (obj1 == obj2) {
        return false;
      }
    }
    else {
      if (obj1->kind != obj1->known->kind) {
        return false;
      }
      if (obj1 == obj2) {
        return false;
      }
      if (obj2->kind != obj2->known->kind) {
        return false;
      }
    }
    if ((obj1->kind == obj2->kind) && (_Var1 = flag_is_equal(obj1->flags,obj2->flags,6), _Var1)) {
      lVar4 = 0x76;
      do {
        if (*(short *)(obj1->flags + lVar4 + -0x4e) != *(short *)(obj2->flags + lVar4 + -0x4e)) {
          return false;
        }
        if (((obj2->flags[lVar4 + -0x4c] ^ obj1->flags[lVar4 + -0x4c]) & 3) != 0) {
          return false;
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xe6);
      if (((obj1->artifact == (artifact *)0x0) && (obj2->artifact == (artifact *)0x0)) &&
         (_Var1 = tval_is_chest(obj1), !_Var1)) {
        _Var1 = tval_is_edible(obj1);
        if ((((!_Var1) && (_Var1 = tval_is_potion(obj1), !_Var1)) &&
            (_Var1 = tval_is_scroll(obj1), !_Var1)) && (_Var1 = tval_is_rod(obj1), !_Var1)) {
          _Var1 = tval_can_have_charges(obj1);
          if ((_Var1) || (_Var1 = tval_is_money(obj1), _Var1)) {
            if (0x7fff < (int)obj2->pval + (int)obj1->pval) {
              return false;
            }
          }
          else {
            _Var1 = tval_is_weapon(obj1);
            if (((_Var1) || (_Var1 = tval_is_armor(obj1), _Var1)) ||
               ((_Var1 = tval_is_jewelry(obj1), _Var1 || (_Var1 = tval_is_light(obj1), _Var1)))) {
              _Var1 = object_fully_known(obj1);
              _Var2 = object_fully_known(obj2);
              if (obj1->ac != obj2->ac) {
                return false;
              }
              if (obj1->dd != obj2->dd) {
                return false;
              }
              if (obj1->ds != obj2->ds) {
                return false;
              }
              if (obj1->to_h != obj2->to_h) {
                return false;
              }
              if (obj1->to_d != obj2->to_d) {
                return false;
              }
              if (obj1->to_a != obj2->to_a) {
                return false;
              }
              lVar4 = 0x29;
              do {
                if (*(short *)(obj1->flags + lVar4 * 2 + -0x4c) !=
                    *(short *)(obj2->flags + lVar4 * 2 + -0x4c)) {
                  return false;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 != 0x3a);
              if (obj1->ego != obj2->ego) {
                return false;
              }
              _Var3 = curses_are_equal(obj1,obj2);
              if (!_Var3) {
                return false;
              }
              if (((obj1->timeout != 0) || (obj2->timeout != 0)) &&
                 (_Var3 = tval_is_light(obj1), !_Var3)) {
                return false;
              }
              if (obj1->timeout == obj2->timeout) {
                if (((byte)((mode & OSTACK_LIST) >> 2) & _Var1 != _Var2) == 0) {
                  return true;
                }
                return false;
              }
              _Var3 = tval_is_light(obj1);
              if (_Var3) {
                return false;
              }
              if ((_Var1 != _Var2 & (byte)((mode & OSTACK_LIST) >> 2)) == 0) {
                return true;
              }
              return false;
            }
          }
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool object_similar(const struct object *obj1, const struct object *obj2,
					  object_stack_t mode)
{
	int i;

	/* Equipment items don't stack */
	if (object_is_equipped(player->body, obj1))
		return false;
	if (object_is_equipped(player->body, obj2))
		return false;

	/* Mimicked items do not stack */
	if (obj1->mimicking_m_idx || obj2->mimicking_m_idx) return false;

	/* If either item is unknown, do not stack */
	if (mode & OSTACK_LIST && obj1->kind != obj1->known->kind) return false;
	if (mode & OSTACK_LIST && obj2->kind != obj2->known->kind) return false;

	/* Hack -- identical items cannot be stacked */
	if (obj1 == obj2) return false;

	/* Require identical object kinds */
	if (obj1->kind != obj2->kind) return false;

	/* Different flags don't stack */
	if (!of_is_equal(obj1->flags, obj2->flags)) return false;

	/* Different elements don't stack */
	for (i = 0; i < ELEM_MAX; i++) {
		if (obj1->el_info[i].res_level != obj2->el_info[i].res_level)
			return false;
		if ((obj1->el_info[i].flags & (EL_INFO_HATES | EL_INFO_IGNORE)) !=
			(obj2->el_info[i].flags & (EL_INFO_HATES | EL_INFO_IGNORE)))
			return false;
	}

	/* Artifacts never stack */
	if (obj1->artifact || obj2->artifact) return false;

	/* Analyze the items */
	if (tval_is_chest(obj1)) {
		/* Chests never stack */
		return false;
	}
	else if (tval_is_edible(obj1) || tval_is_potion(obj1) ||
		tval_is_scroll(obj1) || tval_is_rod(obj1)) {
		/* Food, potions, scrolls and rods all stack nicely,
		   since the kinds are identical, either both will be
		   aware or both will be unaware */
	} else if (tval_can_have_charges(obj1) || tval_is_money(obj1)) {
		/* Gold, staves and wands stack most of the time */
		/* Too much gold or too many charges */
		if (obj1->pval + obj2->pval > MAX_PVAL)
			return false;

		/* ... otherwise ok */
	} else if (tval_is_weapon(obj1) || tval_is_armor(obj1) ||
		tval_is_jewelry(obj1) || tval_is_light(obj1)) {
		bool obj1_is_known = object_fully_known(obj1);
		bool obj2_is_known = object_fully_known(obj2);

		/* Require identical values */
		if (obj1->ac != obj2->ac) return false;
		if (obj1->dd != obj2->dd) return false;
		if (obj1->ds != obj2->ds) return false;

		/* Require identical bonuses */
		if (obj1->to_h != obj2->to_h) return false;
		if (obj1->to_d != obj2->to_d) return false;
		if (obj1->to_a != obj2->to_a) return false;

		/* Require all identical modifiers */
		for (i = 0; i < OBJ_MOD_MAX; i++)
			if (obj1->modifiers[i] != obj2->modifiers[i])
				return (false);

		/* Require identical ego-item types */
		if (obj1->ego != obj2->ego) return false;

		/* Require identical curses */
		if (!curses_are_equal(obj1, obj2)) return false;

		/* Hack - Never stack recharging wearables ... */
		if ((obj1->timeout || obj2->timeout) &&
			!tval_is_light(obj1)) return false;

		/* ... and lights must have same amount of fuel */
		else if ((obj1->timeout != obj2->timeout) &&
				 tval_is_light(obj1)) return false;

		/* Prevent unIDd items stacking with IDd items in the object list */
		if (mode & OSTACK_LIST && (obj1_is_known != obj2_is_known))
			return false;
	} else {
		/* Anything else probably okay */
	}

	/* They must be similar enough */
	return true;
}